

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::JoinHashTable::InitializeScanStructure
          (JoinHashTable *this,ScanStructure *scan_structure,DataChunk *keys,
          TupleDataChunkState *key_state,SelectionVector **current_sel)

{
  idx_t iVar1;
  
  scan_structure->finished = false;
  scan_structure->is_null = false;
  if (this->join_type != INNER) {
    switchD_016d4fed::default
              ((scan_structure->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>.
               _M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
               super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
               super__Head_base<0UL,_bool_*,_false>._M_head_impl,0,0x800);
  }
  TupleDataCollection::ToUnifiedFormat(key_state,keys);
  iVar1 = PrepareKeys(this,keys,&key_state->vector_data,current_sel,&scan_structure->sel_vector,
                      false);
  scan_structure->count = iVar1;
  return;
}

Assistant:

void JoinHashTable::InitializeScanStructure(ScanStructure &scan_structure, DataChunk &keys,
                                            TupleDataChunkState &key_state, const SelectionVector *&current_sel) {
	D_ASSERT(Count() > 0); // should be handled before
	D_ASSERT(finalized);

	// set up the scan structure
	scan_structure.is_null = false;
	scan_structure.finished = false;
	if (join_type != JoinType::INNER) {
		memset(scan_structure.found_match.get(), 0, sizeof(bool) * STANDARD_VECTOR_SIZE);
	}

	// first prepare the keys for probing
	TupleDataCollection::ToUnifiedFormat(key_state, keys);
	scan_structure.count = PrepareKeys(keys, key_state.vector_data, current_sel, scan_structure.sel_vector, false);
}